

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O3

void mayer_dofft(t_sample *fz1,t_sample *fz2,int n,int sgn)

{
  undefined1 auVar1 [16];
  int n_00;
  int iVar2;
  long lVar3;
  double *a;
  
  n_00 = n * 2;
  iVar2 = ooura_init(n_00);
  a = ooura_buffer;
  if (iVar2 != 0) {
    if (n < 1) {
      cdft(n_00,sgn,ooura_buffer,ooura_bitrev,ooura_costab);
      return;
    }
    lVar3 = 0;
    iVar2 = n;
    do {
      auVar1._8_4_ = SUB84((double)*(float *)((long)fz2 + lVar3),0);
      auVar1._0_8_ = (double)*(float *)((long)fz1 + lVar3);
      auVar1._12_4_ = (int)((ulong)(double)*(float *)((long)fz2 + lVar3) >> 0x20);
      *(undefined1 (*) [16])((long)a + lVar3 * 4) = auVar1;
      lVar3 = lVar3 + 4;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    cdft(n_00,sgn,a,ooura_bitrev,ooura_costab);
    if (0 < n) {
      lVar3 = 0;
      do {
        fz1[lVar3] = (float)*a;
        fz2[lVar3] = (float)a[1];
        a = a + 2;
        lVar3 = lVar3 + 1;
      } while (n != (int)lVar3);
    }
  }
  return;
}

Assistant:

EXTERN void mayer_dofft(t_sample *fz1, t_sample *fz2, int n, int sgn)
{
    FFTFLT *buf, *fp3;
    int i;
    t_sample *fp1, *fp2;
    if (!ooura_init(2*n))
        return;
    buf = ooura_buffer;
    for (i = 0, fp1 = fz1, fp2 = fz2, fp3 = buf; i < n; i++)
    {
        fp3[0] = *fp1++;
        fp3[1] = *fp2++;
        fp3 += 2;
    }
    cdft(2*n, sgn, buf, ooura_bitrev, ooura_costab);
    for (i = 0, fp1 = fz1, fp2 = fz2, fp3 = buf; i < n; i++)
    {
        *fp1++ = fp3[0];
        *fp2++ = fp3[1];
        fp3 += 2;
    }
}